

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O1

string * __thiscall
my_lsp_server::lscpp_handle_did_open_abi_cxx11_
          (string *__return_storage_ptr__,my_lsp_server *this,server *param_1,
          DidOpenTextDocumentParams *param_2)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"opened","");
  lscpp::experimental::make_notification_message(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto
  lscpp_handle_did_open(server &, lscpp::protocol::DidOpenTextDocumentParams) {
    return lscpp::experimental::make_notification_message("opened");
  }